

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
libcellml::Parser::ParserImpl::loadReset
          (ParserImpl *this,ResetPtr *reset,ComponentPtr *component,XmlNodePtr *node)

{
  _func_int **pp_Var1;
  Entity *this_00;
  xmlNodePtr this_01;
  IssueImpl *pIVar2;
  _Alloc_hider _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  bool bVar4;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  undefined8 *puVar5;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  element_type *peVar8;
  size_type *psVar9;
  undefined8 *puVar10;
  long *plVar11;
  ulong uVar12;
  ulong uVar13;
  _func_int **pp_Var14;
  undefined8 uVar15;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_03;
  size_t count;
  string variableReference;
  IssuePtr issue_5;
  XmlNodePtr childNode;
  XmlAttributePtr attribute;
  IssuePtr issue;
  IssuePtr issue_2;
  int order;
  string local_1a8;
  string local_188;
  string local_160;
  IssuePtr local_140;
  element_type local_130;
  ResetPtr *local_120;
  string local_118;
  undefined1 local_f8 [48];
  long local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  XmlNode local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a8;
  string local_a0;
  ulong local_80;
  IssuePtr local_78;
  string local_68;
  int local_44;
  ulong local_40;
  XmlNodePtr *local_38;
  
  local_44 = 0;
  local_120 = reset;
  local_f8._32_8_ = this;
  XmlNode::firstAttribute(&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.mPimpl ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    uVar13 = 0;
    uVar12 = 0;
  }
  else {
    local_40 = 0;
    local_80 = 0;
    local_38 = node;
    do {
      paVar7 = &local_188.field_2;
      bVar4 = XmlAttribute::isType((XmlAttribute *)local_b0.mPimpl,"variable","");
      if (bVar4) {
        XmlAttribute::value_abi_cxx11_(&local_188,(XmlAttribute *)local_b0.mPimpl);
        Component::variable((Component *)local_f8,
                            (string *)
                            (component->
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._0_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          Issue::IssueImpl::create();
          pIVar2 = *(IssueImpl **)(local_a0._M_dataplus._M_p + 8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_f8 + 0x28),"Reset referencing variable \'",&local_188);
          plVar6 = (long *)std::__cxx11::string::append((char *)(local_f8 + 0x28));
          local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &local_130;
          peVar8 = (element_type *)(plVar6 + 2);
          if ((element_type *)*plVar6 == peVar8) {
            local_130._vptr_Issue = peVar8->_vptr_Issue;
            local_130.mPimpl = (IssueImpl *)plVar6[3];
          }
          else {
            local_130._vptr_Issue = peVar8->_vptr_Issue;
            local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar6;
          }
          local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[1];
          *plVar6 = (long)peVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          NamedEntity::name_abi_cxx11_
                    (&local_118,
                     (NamedEntity *)
                     (component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
          pp_Var14 = (_func_int **)0xf;
          if (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_130) {
            pp_Var14 = local_130._vptr_Issue;
          }
          pp_Var1 = (_func_int **)
                    ((long)&(local_140.
                             super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_vptr__Sp_counted_base + local_118._M_string_length
                    );
          if (pp_Var14 < pp_Var1) {
            uVar15 = (_func_int **)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              uVar15 = local_118.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar15 < pp_Var1) goto LAB_0024b4b9;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_118,0,(char *)0x0,
                                (ulong)local_140.
                                       super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr);
          }
          else {
LAB_0024b4b9:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_140,(ulong)local_118._M_dataplus._M_p);
          }
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          puVar10 = puVar5 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar10) {
            local_1a8.field_2._M_allocated_capacity = *puVar10;
            local_1a8.field_2._8_8_ = puVar5[3];
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *puVar10;
            local_1a8._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_1a8._M_string_length = puVar5[1];
          *puVar5 = puVar10;
          puVar5[1] = 0;
          *(undefined1 *)puVar10 = 0;
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          psVar9 = puVar5 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_160.field_2._M_allocated_capacity = *psVar9;
            local_160.field_2._8_8_ = puVar5[3];
          }
          else {
            local_160.field_2._M_allocated_capacity = *psVar9;
            local_160._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_160._M_string_length = puVar5[1];
          *puVar5 = psVar9;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          Issue::IssueImpl::setDescription(pIVar2,&local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_130) {
            operator_delete(local_140.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (long)local_130._vptr_Issue + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._40_8_ != &local_c0) {
            operator_delete((void *)local_f8._40_8_,local_c0._M_allocated_capacity + 1);
          }
          AnyCellmlElement::AnyCellmlElementImpl::setReset
                    ((AnyCellmlElementImpl *)
                     **(undefined8 **)(*(long *)(local_a0._M_dataplus._M_p + 8) + 0x28),local_120,
                     RESET);
          Issue::IssueImpl::setReferenceRule
                    (*(IssueImpl **)(local_a0._M_dataplus._M_p + 8),RESET_VARIABLE_REFERENCE);
          Logger::LoggerImpl::addIssue((LoggerImpl *)local_f8._32_8_,(IssuePtr *)&local_a0);
LAB_0024baa1:
          this_03._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length);
            this_03._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_;
          }
        }
        else {
          Reset::setVariable((local_120->
                             super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr,(VariablePtr *)local_f8);
          this_03._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_;
        }
LAB_0024babb:
        if (this_03._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03._M_pi);
        }
LAB_0024bac5:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar4 = XmlAttribute::isType((XmlAttribute *)local_b0.mPimpl,"test_variable","");
        if (bVar4) {
          XmlAttribute::value_abi_cxx11_(&local_188,(XmlAttribute *)local_b0.mPimpl);
          Component::variable((Component *)local_f8,
                              (string *)
                              (component->
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            Reset::setTestVariable
                      ((local_120->super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr,(VariablePtr *)local_f8);
            this_03._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_;
            goto LAB_0024babb;
          }
          Issue::IssueImpl::create();
          pIVar2 = *(IssueImpl **)(local_a0._M_dataplus._M_p + 8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_f8 + 0x28),"Reset referencing test_variable \'",&local_188);
          plVar6 = (long *)std::__cxx11::string::append((char *)(local_f8 + 0x28));
          local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &local_130;
          peVar8 = (element_type *)(plVar6 + 2);
          if ((element_type *)*plVar6 == peVar8) {
            local_130._vptr_Issue = peVar8->_vptr_Issue;
            local_130.mPimpl = (IssueImpl *)plVar6[3];
          }
          else {
            local_130._vptr_Issue = peVar8->_vptr_Issue;
            local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar6;
          }
          local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[1];
          *plVar6 = (long)peVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          NamedEntity::name_abi_cxx11_
                    (&local_118,
                     (NamedEntity *)
                     (component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
          pp_Var14 = (_func_int **)0xf;
          if (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_130) {
            pp_Var14 = local_130._vptr_Issue;
          }
          pp_Var1 = (_func_int **)
                    ((long)&(local_140.
                             super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_vptr__Sp_counted_base + local_118._M_string_length
                    );
          if (pp_Var14 < pp_Var1) {
            uVar15 = (_func_int **)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              uVar15 = local_118.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar15 < pp_Var1) goto LAB_0024b88b;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_118,0,(char *)0x0,
                                (ulong)local_140.
                                       super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr);
          }
          else {
LAB_0024b88b:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_140,(ulong)local_118._M_dataplus._M_p);
          }
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          puVar10 = puVar5 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar10) {
            local_1a8.field_2._M_allocated_capacity = *puVar10;
            local_1a8.field_2._8_8_ = puVar5[3];
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *puVar10;
            local_1a8._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_1a8._M_string_length = puVar5[1];
          *puVar5 = puVar10;
          puVar5[1] = 0;
          *(undefined1 *)puVar10 = 0;
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          psVar9 = puVar5 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_160.field_2._M_allocated_capacity = *psVar9;
            local_160.field_2._8_8_ = puVar5[3];
          }
          else {
            local_160.field_2._M_allocated_capacity = *psVar9;
            local_160._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_160._M_string_length = puVar5[1];
          *puVar5 = psVar9;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          Issue::IssueImpl::setDescription(pIVar2,&local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_130) {
            operator_delete(local_140.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (long)local_130._vptr_Issue + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._40_8_ != &local_c0) {
            operator_delete((void *)local_f8._40_8_,local_c0._M_allocated_capacity + 1);
          }
          AnyCellmlElement::AnyCellmlElementImpl::setReset
                    ((AnyCellmlElementImpl *)
                     **(undefined8 **)(*(long *)(local_a0._M_dataplus._M_p + 8) + 0x28),local_120,
                     RESET);
          Issue::IssueImpl::setReferenceRule
                    (*(IssueImpl **)(local_a0._M_dataplus._M_p + 8),RESET_TEST_VARIABLE_REFERENCE);
          Logger::LoggerImpl::addIssue((LoggerImpl *)local_f8._32_8_,(IssuePtr *)&local_a0);
          goto LAB_0024baa1;
        }
        bVar4 = XmlAttribute::isType((XmlAttribute *)local_b0.mPimpl,"order","");
        if (bVar4) {
          XmlAttribute::value_abi_cxx11_(&local_188,(XmlAttribute *)local_b0.mPimpl);
          bVar4 = isCellMLInteger(&local_188);
          local_80 = CONCAT71(extraout_var,bVar4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar7) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          if ((char)local_80 == '\0') {
            local_188._M_string_length = 0;
            local_188.field_2._M_allocated_capacity =
                 local_188.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_188._M_dataplus._M_p = (pointer)paVar7;
            Reset::variable((local_120->
                            super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           );
            _Var3._M_p = local_160._M_dataplus._M_p;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._M_string_length)
              ;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var3._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              Reset::variable((local_120->
                              super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr);
              NamedEntity::name_abi_cxx11_(&local_160,(NamedEntity *)local_1a8._M_dataplus._M_p);
              std::__cxx11::string::operator=((string *)&local_188,(string *)&local_160);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_1a8._M_string_length);
              }
            }
            Issue::IssueImpl::create();
            pIVar2 = (local_78.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl;
            NamedEntity::name_abi_cxx11_
                      (&local_a0,
                       (NamedEntity *)
                       (component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
            ;
            plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x2b50ea);
            local_f8._0_8_ = local_f8 + 0x10;
            paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 == paVar7) {
              local_f8._16_8_ = paVar7->_M_allocated_capacity;
              local_f8._24_8_ = plVar6[3];
            }
            else {
              local_f8._16_8_ = paVar7->_M_allocated_capacity;
              local_f8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar6;
            }
            local_f8._8_8_ = plVar6[1];
            *plVar6 = (long)paVar7;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append(local_f8);
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            plVar11 = plVar6 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar11) {
              local_118.field_2._M_allocated_capacity = *plVar11;
              local_118.field_2._8_8_ = plVar6[3];
            }
            else {
              local_118.field_2._M_allocated_capacity = *plVar11;
              local_118._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_118._M_string_length = plVar6[1];
            *plVar6 = (long)plVar11;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_118,(ulong)local_188._M_dataplus._M_p);
            local_f8._40_8_ = &local_c0;
            paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 == paVar7) {
              local_c0._M_allocated_capacity = paVar7->_M_allocated_capacity;
              local_c0._8_8_ = plVar6[3];
            }
            else {
              local_c0._M_allocated_capacity = paVar7->_M_allocated_capacity;
              local_f8._40_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar6;
            }
            local_c8 = plVar6[1];
            *plVar6 = (long)paVar7;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append(local_f8 + 0x28);
            local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 &local_130;
            peVar8 = (element_type *)(plVar6 + 2);
            if ((element_type *)*plVar6 == peVar8) {
              local_130._vptr_Issue = peVar8->_vptr_Issue;
              local_130.mPimpl = (IssueImpl *)plVar6[3];
            }
            else {
              local_130._vptr_Issue = peVar8->_vptr_Issue;
              local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)*plVar6;
            }
            local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[1];
            *plVar6 = (long)peVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            XmlAttribute::value_abi_cxx11_(&local_68,(XmlAttribute *)local_b0.mPimpl);
            pp_Var14 = (_func_int **)0xf;
            if (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                &local_130) {
              pp_Var14 = local_130._vptr_Issue;
            }
            pp_Var1 = (_func_int **)
                      ((long)&(local_140.
                               super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base +
                      local_68._M_string_length);
            if (pp_Var14 < pp_Var1) {
              uVar15 = (_func_int **)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != &local_68.field_2) {
                uVar15 = local_68.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar15 < pp_Var1) goto LAB_0024bd92;
              puVar5 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_68,0,(char *)0x0,
                                  (ulong)local_140.
                                         super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr);
            }
            else {
LAB_0024bd92:
              puVar5 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_140,(ulong)local_68._M_dataplus._M_p);
            }
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            puVar10 = puVar5 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar10) {
              local_1a8.field_2._M_allocated_capacity = *puVar10;
              local_1a8.field_2._8_8_ = puVar5[3];
            }
            else {
              local_1a8.field_2._M_allocated_capacity = *puVar10;
              local_1a8._M_dataplus._M_p = (pointer)*puVar5;
            }
            local_1a8._M_string_length = puVar5[1];
            *puVar5 = puVar10;
            puVar5[1] = 0;
            *(undefined1 *)puVar10 = 0;
            puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
            local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
            psVar9 = puVar5 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_160.field_2._M_allocated_capacity = *psVar9;
              local_160.field_2._8_8_ = puVar5[3];
            }
            else {
              local_160.field_2._M_allocated_capacity = *psVar9;
              local_160._M_dataplus._M_p = (pointer)*puVar5;
            }
            local_160._M_string_length = puVar5[1];
            *puVar5 = psVar9;
            puVar5[1] = 0;
            *(undefined1 *)(puVar5 + 2) = 0;
            Issue::IssueImpl::setDescription(pIVar2,&local_160);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            if (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                &local_130) {
              operator_delete(local_140.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,(long)local_130._vptr_Issue + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._40_8_ != &local_c0) {
              operator_delete((void *)local_f8._40_8_,local_c0._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_f8 + 0x10)) {
              operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            AnyCellmlElement::AnyCellmlElementImpl::setReset
                      ((((local_78.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl->mItem).
                        super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,local_120,RESET);
            Issue::IssueImpl::setReferenceRule
                      ((local_78.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,RESET_ORDER_VALUE);
            Logger::LoggerImpl::addIssue((LoggerImpl *)local_f8._32_8_,&local_78);
            uVar13 = extraout_RAX_00;
            if (local_78.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_78.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              uVar13 = extraout_RAX_01;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
              uVar13 = extraout_RAX_02;
            }
          }
          else {
            XmlAttribute::value_abi_cxx11_(&local_188,(XmlAttribute *)local_b0.mPimpl);
            bVar4 = convertToInt(&local_188,&local_44);
            uVar13 = CONCAT71(extraout_var_00,bVar4);
            local_80 = uVar13;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != paVar7) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
              uVar13 = extraout_RAX;
            }
            if ((char)local_80 == '\0') {
              local_40 = CONCAT71((int7)(uVar13 >> 8),1);
              local_188._M_string_length = 0;
              local_188.field_2._M_allocated_capacity =
                   local_188.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_188._M_dataplus._M_p = (pointer)paVar7;
              Reset::variable((local_120->
                              super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr);
              _Var3._M_p = local_160._M_dataplus._M_p;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_160._M_string_length);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var3._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                Reset::variable((local_120->
                                super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr);
                NamedEntity::name_abi_cxx11_(&local_160,(NamedEntity *)local_1a8._M_dataplus._M_p);
                std::__cxx11::string::operator=((string *)&local_188,(string *)&local_160);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_160._M_dataplus._M_p != &local_160.field_2) {
                  operator_delete(local_160._M_dataplus._M_p,
                                  local_160.field_2._M_allocated_capacity + 1);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._M_string_length !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_1a8._M_string_length);
                }
              }
              Issue::IssueImpl::create();
              pIVar2 = (local_78.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl;
              NamedEntity::name_abi_cxx11_
                        (&local_a0,
                         (NamedEntity *)
                         (component->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
              plVar6 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_a0,0,(char *)0x0,0x2b50ea);
              local_f8._0_8_ = local_f8 + 0x10;
              paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 == paVar7) {
                local_f8._16_8_ = paVar7->_M_allocated_capacity;
                local_f8._24_8_ = plVar6[3];
              }
              else {
                local_f8._16_8_ = paVar7->_M_allocated_capacity;
                local_f8._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*plVar6;
              }
              local_f8._8_8_ = plVar6[1];
              *plVar6 = (long)paVar7;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::append(local_f8);
              local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
              plVar11 = plVar6 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar11) {
                local_118.field_2._M_allocated_capacity = *plVar11;
                local_118.field_2._8_8_ = plVar6[3];
              }
              else {
                local_118.field_2._M_allocated_capacity = *plVar11;
                local_118._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_118._M_string_length = plVar6[1];
              *plVar6 = (long)plVar11;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_118,(ulong)local_188._M_dataplus._M_p);
              local_f8._40_8_ = &local_c0;
              paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 == paVar7) {
                local_c0._M_allocated_capacity = paVar7->_M_allocated_capacity;
                local_c0._8_8_ = plVar6[3];
              }
              else {
                local_c0._M_allocated_capacity = paVar7->_M_allocated_capacity;
                local_f8._40_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*plVar6;
              }
              local_c8 = plVar6[1];
              *plVar6 = (long)paVar7;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::append(local_f8 + 0x28);
              local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   &local_130;
              peVar8 = (element_type *)(plVar6 + 2);
              if ((element_type *)*plVar6 == peVar8) {
                local_130._vptr_Issue = peVar8->_vptr_Issue;
                local_130.mPimpl = (IssueImpl *)plVar6[3];
              }
              else {
                local_130._vptr_Issue = peVar8->_vptr_Issue;
                local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)*plVar6;
              }
              local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[1];
              *plVar6 = (long)peVar8;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              XmlAttribute::value_abi_cxx11_(&local_68,(XmlAttribute *)local_b0.mPimpl);
              pp_Var14 = (_func_int **)0xf;
              if (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  != &local_130) {
                pp_Var14 = local_130._vptr_Issue;
              }
              pp_Var1 = (_func_int **)
                        ((long)&(local_140.
                                 super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_vptr__Sp_counted_base +
                        local_68._M_string_length);
              if (pp_Var14 < pp_Var1) {
                uVar15 = (_func_int **)0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p != &local_68.field_2) {
                  uVar15 = local_68.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar15 < pp_Var1) goto LAB_0024c392;
                puVar5 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_68,0,(char *)0x0,
                                    (ulong)local_140.
                                           super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
              }
              else {
LAB_0024c392:
                puVar5 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_140,(ulong)local_68._M_dataplus._M_p);
              }
              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
              puVar10 = puVar5 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar10) {
                local_1a8.field_2._M_allocated_capacity = *puVar10;
                local_1a8.field_2._8_8_ = puVar5[3];
              }
              else {
                local_1a8.field_2._M_allocated_capacity = *puVar10;
                local_1a8._M_dataplus._M_p = (pointer)*puVar5;
              }
              local_1a8._M_string_length = puVar5[1];
              *puVar5 = puVar10;
              puVar5[1] = 0;
              *(undefined1 *)puVar10 = 0;
              puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
              local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
              psVar9 = puVar5 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar9) {
                local_160.field_2._M_allocated_capacity = *psVar9;
                local_160.field_2._8_8_ = puVar5[3];
              }
              else {
                local_160.field_2._M_allocated_capacity = *psVar9;
                local_160._M_dataplus._M_p = (pointer)*puVar5;
              }
              local_160._M_string_length = puVar5[1];
              *puVar5 = psVar9;
              puVar5[1] = 0;
              *(undefined1 *)(puVar5 + 2) = 0;
              Issue::IssueImpl::setDescription(pIVar2,&local_160);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != &local_68.field_2) {
                operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  != &local_130) {
                operator_delete(local_140.
                                super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr,(long)local_130._vptr_Issue + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._40_8_ != &local_c0) {
                operator_delete((void *)local_f8._40_8_,local_c0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_f8 + 0x10)) {
                operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1
                               );
              }
              AnyCellmlElement::AnyCellmlElementImpl::setReset
                        ((((local_78.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->mPimpl->mItem).
                          super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl,local_120,RESET);
              Issue::IssueImpl::setReferenceRule
                        ((local_78.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl,RESET_ORDER_VALUE);
              Logger::LoggerImpl::addIssue((LoggerImpl *)local_f8._32_8_,&local_78);
              this_03._M_pi =
                   local_78.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              goto LAB_0024babb;
            }
          }
          local_40 = CONCAT71((int7)(uVar13 >> 8),1);
        }
        else {
          bVar4 = XmlAttribute::isType((XmlAttribute *)local_b0.mPimpl,"id","");
          if (bVar4) {
            this_00 = (Entity *)
                      (local_120->super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr;
            XmlAttribute::value_abi_cxx11_(&local_188,(XmlAttribute *)local_b0.mPimpl);
            Entity::setId(this_00,&local_188);
            goto LAB_0024bac5;
          }
          Issue::IssueImpl::create();
          this_01 = ((XmlNodeImpl *)(local_f8._0_8_ + 8))->mXmlNodePtr;
          NamedEntity::name_abi_cxx11_
                    ((string *)(local_f8 + 0x28),
                     (NamedEntity *)
                     (component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
          plVar6 = (long *)std::__cxx11::string::replace
                                     ((ulong)(local_f8 + 0x28),0,(char *)0x0,0x2b50ea);
          local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &local_130;
          peVar8 = (element_type *)(plVar6 + 2);
          if ((element_type *)*plVar6 == peVar8) {
            local_130._vptr_Issue = peVar8->_vptr_Issue;
            local_130.mPimpl = (IssueImpl *)plVar6[3];
          }
          else {
            local_130._vptr_Issue = peVar8->_vptr_Issue;
            local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar6;
          }
          local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[1];
          *plVar6 = (long)peVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          puVar10 = puVar5 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar10) {
            local_1a8.field_2._M_allocated_capacity = *puVar10;
            local_1a8.field_2._8_8_ = puVar5[3];
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *puVar10;
            local_1a8._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_1a8._M_string_length = puVar5[1];
          *puVar5 = puVar10;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          XmlAttribute::name_abi_cxx11_(&local_118,(XmlAttribute *)local_b0.mPimpl);
          uVar15 = (_func_int **)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            uVar15 = local_1a8.field_2._M_allocated_capacity;
          }
          pp_Var14 = (_func_int **)
                     ((long)(_func_int ***)local_1a8._M_string_length + local_118._M_string_length);
          if ((ulong)uVar15 < pp_Var14) {
            uVar15 = (_func_int **)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              uVar15 = local_118.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar15 < pp_Var14) goto LAB_0024bbc1;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_118,0,(char *)0x0,(ulong)local_1a8._M_dataplus._M_p);
          }
          else {
LAB_0024bbc1:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_1a8,(ulong)local_118._M_dataplus._M_p);
          }
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          psVar9 = puVar5 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_160.field_2._M_allocated_capacity = *psVar9;
            local_160.field_2._8_8_ = puVar5[3];
          }
          else {
            local_160.field_2._M_allocated_capacity = *psVar9;
            local_160._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_160._M_string_length = puVar5[1];
          *puVar5 = psVar9;
          puVar5[1] = 0;
          *(undefined1 *)psVar9 = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_160);
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 == paVar7) {
            local_188.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_188.field_2._8_8_ = plVar6[3];
          }
          else {
            local_188.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_188._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_188._M_string_length = plVar6[1];
          *plVar6 = (long)paVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          Issue::IssueImpl::setDescription((IssueImpl *)this_01,&local_188);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          if (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_130) {
            operator_delete(local_140.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (long)local_130._vptr_Issue + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._40_8_ != &local_c0) {
            operator_delete((void *)local_f8._40_8_,local_c0._M_allocated_capacity + 1);
          }
          AnyCellmlElement::AnyCellmlElementImpl::setReset
                    ((AnyCellmlElementImpl *)
                     ((XmlNodeImpl *)(local_f8._0_8_ + 8))->mXmlNodePtr->parent->_private,local_120,
                     RESET);
          Issue::IssueImpl::setReferenceRule
                    ((IssueImpl *)((XmlNodeImpl *)(local_f8._0_8_ + 8))->mXmlNodePtr,
                     RESET_ATTRIBUTE_REQUIRED);
          Logger::LoggerImpl::addIssue((LoggerImpl *)local_f8._32_8_,(IssuePtr *)local_f8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
          }
        }
      }
      XmlAttribute::next((XmlAttribute *)&local_188);
      this_02 = p_Stack_a8;
      p_Stack_a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._M_string_length;
      local_b0.mPimpl = (XmlNodeImpl *)local_188._M_dataplus._M_p;
      local_188._M_dataplus._M_p = (pointer)0x0;
      local_188._M_string_length = 0;
      if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._M_string_length);
      }
      uVar13 = local_80;
      uVar12 = local_40;
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_b0.mPimpl !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0);
  }
  if ((uVar13 & 1) == 0) {
    if ((uVar12 & 1) == 0) {
      Issue::IssueImpl::create();
      pIVar2 = (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl;
      NamedEntity::name_abi_cxx11_
                (&local_1a8,
                 (NamedEntity *)
                 (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
      puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,0x2b50ea)
      ;
      psVar9 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_160.field_2._M_allocated_capacity = *psVar9;
        local_160.field_2._8_8_ = puVar5[3];
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      }
      else {
        local_160.field_2._M_allocated_capacity = *psVar9;
        local_160._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_160._M_string_length = puVar5[1];
      *puVar5 = psVar9;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_160);
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar7) {
        local_188.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_188.field_2._8_8_ = plVar6[3];
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      }
      else {
        local_188.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_188._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_188._M_string_length = plVar6[1];
      *plVar6 = (long)paVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      Issue::IssueImpl::setDescription(pIVar2,&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      AnyCellmlElement::AnyCellmlElementImpl::setReset
                ((((local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl->mItem).
                  super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->mPimpl,local_120,RESET);
      Issue::IssueImpl::setReferenceRule
                ((local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->mPimpl,RESET_ORDER_VALUE);
      Logger::LoggerImpl::addIssue((LoggerImpl *)local_f8._32_8_,&local_140);
      if (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
  }
  else {
    Reset::setOrder((local_120->super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr,local_44);
  }
  XmlNode::firstChild((XmlNode *)local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._0_8_ ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    count = 0;
    uVar13 = 0;
  }
  else {
    uVar13 = 0;
    count = 0;
    do {
      bVar4 = XmlNode::isCellml20Element((XmlNode *)local_f8._0_8_,"test_value");
      if (bVar4) {
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"test_value","");
        loadResetChild((ParserImpl *)local_f8._32_8_,&local_188,local_120,component,
                       (XmlNodePtr *)local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        count = count + 1;
      }
      else {
        bVar4 = XmlNode::isCellml20Element((XmlNode *)local_f8._0_8_,"reset_value");
        if (bVar4) {
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"reset_value","");
          loadResetChild((ParserImpl *)local_f8._32_8_,&local_188,local_120,component,
                         (XmlNodePtr *)local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          uVar13 = uVar13 + 1;
        }
        else {
          bVar4 = XmlNode::isText((XmlNode *)local_f8._0_8_);
          if (bVar4) {
            XmlNode::convertToString_abi_cxx11_(&local_188,(XmlNode *)local_f8._0_8_);
            bVar4 = hasNonWhitespaceCharacters(&local_188);
            if (bVar4) {
              Issue::IssueImpl::create();
              pIVar2 = (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl;
              std::operator+(&local_1a8,"Reset has an invalid non-whitespace child text element \'",
                             &local_188);
              puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
              local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
              psVar9 = puVar5 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar9) {
                local_160.field_2._M_allocated_capacity = *psVar9;
                local_160.field_2._8_8_ = puVar5[3];
              }
              else {
                local_160.field_2._M_allocated_capacity = *psVar9;
                local_160._M_dataplus._M_p = (pointer)*puVar5;
              }
              local_160._M_string_length = puVar5[1];
              *puVar5 = psVar9;
              puVar5[1] = 0;
              *(undefined1 *)(puVar5 + 2) = 0;
              Issue::IssueImpl::setDescription(pIVar2,&local_160);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              AnyCellmlElement::AnyCellmlElementImpl::setReset
                        ((((local_140.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->mPimpl->mItem).
                          super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl,local_120,RESET);
              Issue::IssueImpl::setReferenceRule
                        ((local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl,XML_UNEXPECTED_CHARACTER);
              Logger::LoggerImpl::addIssue((LoggerImpl *)local_f8._32_8_,&local_140);
              if (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_140.
                           super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            bVar4 = XmlNode::isComment((XmlNode *)local_f8._0_8_);
            if (!bVar4) {
              local_80 = uVar13;
              Issue::IssueImpl::create();
              pIVar2 = *(IssueImpl **)(local_a0._M_dataplus._M_p + 8);
              NamedEntity::name_abi_cxx11_
                        ((string *)(local_f8 + 0x28),
                         (NamedEntity *)
                         (component->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
              plVar6 = (long *)std::__cxx11::string::replace
                                         ((ulong)(local_f8 + 0x28),0,(char *)0x0,0x2b50ea);
              local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   &local_130;
              peVar8 = (element_type *)(plVar6 + 2);
              if ((element_type *)*plVar6 == peVar8) {
                local_130._vptr_Issue = peVar8->_vptr_Issue;
                local_130.mPimpl = (IssueImpl *)plVar6[3];
              }
              else {
                local_130._vptr_Issue = peVar8->_vptr_Issue;
                local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)*plVar6;
              }
              local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[1];
              *plVar6 = (long)peVar8;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
              puVar10 = puVar5 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar10) {
                local_1a8.field_2._M_allocated_capacity = *puVar10;
                local_1a8.field_2._8_8_ = puVar5[3];
              }
              else {
                local_1a8.field_2._M_allocated_capacity = *puVar10;
                local_1a8._M_dataplus._M_p = (pointer)*puVar5;
              }
              local_1a8._M_string_length = puVar5[1];
              *puVar5 = puVar10;
              puVar5[1] = 0;
              *(undefined1 *)(puVar5 + 2) = 0;
              XmlNode::name_abi_cxx11_(&local_118,(XmlNode *)local_f8._0_8_);
              uVar15 = (_func_int **)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                uVar15 = local_1a8.field_2._M_allocated_capacity;
              }
              pp_Var14 = (_func_int **)
                         ((long)(_func_int ***)local_1a8._M_string_length +
                         local_118._M_string_length);
              if ((ulong)uVar15 < pp_Var14) {
                uVar15 = (_func_int **)0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p != &local_118.field_2) {
                  uVar15 = local_118.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar15 < pp_Var14) goto LAB_0024cba1;
                puVar5 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_118,0,(char *)0x0,
                                    (ulong)local_1a8._M_dataplus._M_p);
              }
              else {
LAB_0024cba1:
                puVar5 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_1a8,(ulong)local_118._M_dataplus._M_p);
              }
              local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
              psVar9 = puVar5 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar9) {
                local_160.field_2._M_allocated_capacity = *psVar9;
                local_160.field_2._8_8_ = puVar5[3];
              }
              else {
                local_160.field_2._M_allocated_capacity = *psVar9;
                local_160._M_dataplus._M_p = (pointer)*puVar5;
              }
              local_160._M_string_length = puVar5[1];
              *puVar5 = psVar9;
              puVar5[1] = 0;
              *(undefined1 *)psVar9 = 0;
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_160);
              local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
              paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 == paVar7) {
                local_188.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
                local_188.field_2._8_8_ = plVar6[3];
              }
              else {
                local_188.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
                local_188._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_188._M_string_length = plVar6[1];
              *plVar6 = (long)paVar7;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              Issue::IssueImpl::setDescription(pIVar2,&local_188);
              uVar13 = local_80;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != &local_188.field_2) {
                operator_delete(local_188._M_dataplus._M_p,
                                local_188.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              if (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  != &local_130) {
                operator_delete(local_140.
                                super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr,(long)local_130._vptr_Issue + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._40_8_ != &local_c0) {
                operator_delete((void *)local_f8._40_8_,local_c0._M_allocated_capacity + 1);
              }
              AnyCellmlElement::AnyCellmlElementImpl::setReset
                        ((AnyCellmlElementImpl *)
                         **(undefined8 **)(*(long *)(local_a0._M_dataplus._M_p + 8) + 0x28),
                         local_120,RESET);
              Issue::IssueImpl::setReferenceRule
                        (*(IssueImpl **)(local_a0._M_dataplus._M_p + 8),XML_UNEXPECTED_ELEMENT);
              Logger::LoggerImpl::addIssue((LoggerImpl *)local_f8._32_8_,(IssuePtr *)&local_a0);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length
                          );
              }
            }
          }
        }
      }
      XmlNode::next((XmlNode *)&local_188);
      uVar15 = local_f8._8_8_;
      local_f8._8_8_ = local_188._M_string_length;
      local_f8._0_8_ = local_188._M_dataplus._M_p;
      local_188._M_dataplus._M_p = (pointer)0x0;
      local_188._M_string_length = 0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar15 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar15);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._M_string_length);
      }
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_f8._0_8_ !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0);
  }
  paVar7 = &local_188.field_2;
  local_188._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"test_value","");
  checkResetChildMultiplicity((ParserImpl *)local_f8._32_8_,count,&local_188,local_120,component);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar7) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  local_188._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"reset_value","");
  checkResetChildMultiplicity((ParserImpl *)local_f8._32_8_,uVar13,&local_188,local_120,component);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar7) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
  }
  if (p_Stack_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a8);
  }
  return;
}

Assistant:

void Parser::ParserImpl::loadReset(const ResetPtr &reset, const ComponentPtr &component, const XmlNodePtr &node)
{
    int order = 0;
    bool orderValid = false;
    bool orderDefined = false;

    XmlAttributePtr attribute = node->firstAttribute();
    while (attribute != nullptr) {
        if (attribute->isType("variable")) {
            const std::string variableReference = attribute->value();
            VariablePtr referencedVariable = component->variable(variableReference);

            if (referencedVariable == nullptr) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Reset referencing variable '" + variableReference + "' is not a valid reference for a variable in component '" + component->name() + "'.");
                issue->mPimpl->mItem->mPimpl->setReset(reset);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_VARIABLE_REFERENCE);
                addIssue(issue);
            } else {
                reset->setVariable(referencedVariable);
            }
        } else if (attribute->isType("test_variable")) {
            const std::string testVariableReference = attribute->value();
            VariablePtr testVariable = component->variable(testVariableReference);
            if (testVariable == nullptr) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Reset referencing test_variable '" + testVariableReference + "' is not a valid reference for a variable in component '" + component->name() + "'.");
                issue->mPimpl->mItem->mPimpl->setReset(reset);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_TEST_VARIABLE_REFERENCE);
                addIssue(issue);
            } else {
                reset->setTestVariable(testVariable);
            }
        } else if (attribute->isType("order")) {
            orderDefined = true;
            orderValid = isCellMLInteger(attribute->value());
            if (orderValid) {
                orderValid = convertToInt(attribute->value(), order);
                if (!orderValid) {
                    std::string variableName;
                    if (reset->variable() != nullptr) {
                        variableName = reset->variable()->name();
                    }
                    auto issue = Issue::IssueImpl::create();
                    issue->mPimpl->setDescription("Reset in component '" + component->name() + "' referencing variable '" + variableName + "' has an out of range integer order value '" + attribute->value() + "'.");
                    issue->mPimpl->mItem->mPimpl->setReset(reset);
                    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_ORDER_VALUE);
                    addIssue(issue);
                }
            } else { // This value won't be saved for validation later, so it does need to be reported now.
                std::string variableName;
                if (reset->variable() != nullptr) {
                    variableName = reset->variable()->name();
                }
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Reset in component '" + component->name() + "' referencing variable '" + variableName + "' has a non-integer order value '" + attribute->value() + "'.");
                issue->mPimpl->mItem->mPimpl->setReset(reset);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_ORDER_VALUE);
                addIssue(issue);
            }
        } else if (attribute->isType("id")) {
            reset->setId(attribute->value());
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Reset in component '" + component->name() + "' has an invalid attribute '" + attribute->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setReset(reset);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_ATTRIBUTE_REQUIRED);
            addIssue(issue);
        }
        attribute = attribute->next();
    }

    if (orderValid) {
        reset->setOrder(order);
    } else if (!orderDefined) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Reset in component '" + component->name() + "' does not have its order set.");
        issue->mPimpl->mItem->mPimpl->setReset(reset);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_ORDER_VALUE);
        addIssue(issue);
    }

    XmlNodePtr childNode = node->firstChild();

    size_t testValueCount = 0;
    size_t resetValueCount = 0;
    while (childNode != nullptr) {
        if (childNode->isCellml20Element("test_value")) {
            loadResetChild("test_value", reset, component, childNode);
            testValueCount++;
        } else if (childNode->isCellml20Element("reset_value")) {
            loadResetChild("reset_value", reset, component, childNode);
            resetValueCount++;
        } else if (childNode->isText()) {
            std::string textNode = childNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Reset has an invalid non-whitespace child text element '" + textNode + "'. Either a test_value block or a reset_value block is expected.");
                issue->mPimpl->mItem->mPimpl->setReset(reset);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            }
        } else if (childNode->isComment()) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Reset in component '" + component->name() + "' has an invalid child '" + childNode->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setReset(reset);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_ELEMENT);
            addIssue(issue);
        }
        childNode = childNode->next();
    }

    checkResetChildMultiplicity(testValueCount, "test_value", reset, component);
    checkResetChildMultiplicity(resetValueCount, "reset_value", reset, component);
}